

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O0

void __thiscall
t_perl_generator::generate_deserialize_map_element
          (t_perl_generator *this,ostream *out,t_map *tmap,string *prefix)

{
  t_type *ptVar1;
  ostream *poVar2;
  allocator local_2f1;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  undefined1 local_248 [8];
  t_field fval;
  undefined1 local_178 [8];
  t_field fkey;
  string local_c0;
  undefined1 local_a0 [8];
  string val;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  string key;
  string *prefix_local;
  t_map *tmap_local;
  ostream *out_local;
  t_perl_generator *this_local;
  
  key.field_2._8_8_ = prefix;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"key",&local_69);
  t_generator::tmp((string *)local_48,(t_generator *)this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"val",(allocator *)&fkey.field_0xaf);
  t_generator::tmp((string *)local_a0,(t_generator *)this,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&fkey.field_0xaf);
  ptVar1 = t_map::get_key_type(tmap);
  std::__cxx11::string::string((string *)&fval.reference_,(string *)local_48);
  t_field::t_field((t_field *)local_178,ptVar1,(string *)&fval.reference_);
  std::__cxx11::string::~string((string *)&fval.reference_);
  ptVar1 = t_map::get_val_type(tmap);
  std::__cxx11::string::string((string *)&local_268,(string *)local_a0);
  t_field::t_field((t_field *)local_248,ptVar1,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  poVar2 = t_generator::indent((t_generator *)this,out);
  declare_field_abi_cxx11_(&local_288,this,(t_field *)local_178,true,true);
  poVar2 = std::operator<<(poVar2,(string *)&local_288);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_288);
  poVar2 = t_generator::indent((t_generator *)this,out);
  declare_field_abi_cxx11_(&local_2a8,this,(t_field *)local_248,true,true);
  poVar2 = std::operator<<(poVar2,(string *)&local_2a8);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,"",&local_2c9);
  generate_deserialize_field(this,out,(t_field *)local_178,&local_2c8,false);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f0,"",&local_2f1);
  generate_deserialize_field(this,out,(t_field *)local_248,&local_2f0,false);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"$");
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,"->{$");
  poVar2 = std::operator<<(poVar2,(string *)local_48);
  poVar2 = std::operator<<(poVar2,"} = $");
  poVar2 = std::operator<<(poVar2,(string *)local_a0);
  poVar2 = std::operator<<(poVar2,";");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_field::~t_field((t_field *)local_248);
  t_field::~t_field((t_field *)local_178);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void t_perl_generator::generate_deserialize_map_element(ostream& out, t_map* tmap, string prefix) {
  string key = tmp("key");
  string val = tmp("val");
  t_field fkey(tmap->get_key_type(), key);
  t_field fval(tmap->get_val_type(), val);

  indent(out) << declare_field(&fkey, true, true) << endl;
  indent(out) << declare_field(&fval, true, true) << endl;

  generate_deserialize_field(out, &fkey);
  generate_deserialize_field(out, &fval);

  indent(out) << "$" << prefix << "->{$" << key << "} = $" << val << ";" << endl;
}